

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O1

void __thiscall PrimitiveDisplayer::drawQuad(PrimitiveDisplayer *this,Quad *quad)

{
  float *pfVar1;
  Colour *pCVar2;
  GLfloat *pGVar3;
  
  glPushMatrix();
  glShadeModel(0x1d00);
  pfVar1 = Quad::toVerticesWithInvertedY(quad,this->pixelsPerSquare);
  pCVar2 = Quad::getFillColour(quad);
  pGVar3 = Colour::getColour3fv(pCVar2);
  glColor3fv(pGVar3);
  glEnableClientState(0x8074);
  glVertexPointer(2,0x1406,0,pfVar1);
  glDrawArrays(7,0,4);
  pCVar2 = Quad::getLineColour(quad);
  pGVar3 = Colour::getColour3fv(pCVar2);
  glColor3fv(pGVar3);
  glLineWidth(0x40000000);
  glDrawArrays(2,0,4);
  glDisableClientState(0x8074);
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  glPopMatrix();
  return;
}

Assistant:

void PrimitiveDisplayer::drawQuad(Quad* quad) {
    glPushMatrix();
        glShadeModel(GL_FLAT);
        float* vertices = quad->toVerticesWithInvertedY(pixelsPerSquare);
        
        glColor3fv(quad->getFillColour()->getColour3fv());
        glEnableClientState(GL_VERTEX_ARRAY);
        glVertexPointer(2, GL_FLOAT, 0, vertices);
        glDrawArrays(GL_QUADS, 0, 4);
        
        glColor3fv(quad->getLineColour()->getColour3fv());
        glLineWidth(2);
        glDrawArrays(GL_LINE_LOOP, 0, 4);
        
        glDisableClientState(GL_VERTEX_ARRAY);
        delete[] vertices;
        vertices = nullptr;
    glPopMatrix();
}